

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

HelicsEndpoint helicsFederateGetEndpoint(HelicsFederate fed,char *name,HelicsError *err)

{
  size_t sVar1;
  Endpoint *endp;
  char *pcVar2;
  HelicsEndpoint pvVar3;
  string_view eptName;
  shared_ptr<helics::MessageFederate> fedObj;
  MessageFederate *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  getMessageFedSharedPtr(&local_30,(HelicsError *)fed);
  if (local_30 != (MessageFederate *)0x0) {
    if (name == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        pcVar2 = "The supplied string argument is null and therefore invalid";
LAB_00187b7b:
        err->error_code = -4;
        err->message = pcVar2;
      }
    }
    else {
      sVar1 = strlen(name);
      eptName._M_str = name;
      eptName._M_len = sVar1;
      endp = helics::MessageFederate::getEndpoint(local_30,eptName);
      if ((endp->super_Interface).handle.hid != -1700000000) {
        pvVar3 = anon_unknown.dwarf_8bada::findOrCreateEndpoint(fed,endp);
        goto LAB_00187b88;
      }
      if (err != (HelicsError *)0x0) {
        pcVar2 = "the specified Endpoint name is not recognized";
        goto LAB_00187b7b;
      }
    }
  }
  pvVar3 = (HelicsEndpoint)0x0;
LAB_00187b88:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return pvVar3;
}

Assistant:

HelicsEndpoint helicsFederateGetEndpoint(HelicsFederate fed, const char* name, HelicsError* err)
{
    auto fedObj = getMessageFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    CHECK_NULL_STRING(name, nullptr);
    try {
        auto& ept = fedObj->getEndpoint(name);
        if (!ept.isValid()) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidEndName);
            return nullptr;
        }
        return findOrCreateEndpoint(fed, ept);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
    // LCOV_EXCL_STOP
}